

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O0

ostream * wasm::anon_unknown_11::operator<<(ostream *o,Mode *mode)

{
  Mode *mode_local;
  ostream *o_local;
  
  switch(*mode) {
  case Split:
    std::operator<<(o,"split");
    break;
  case MultiSplit:
    std::operator<<(o,"multi-split");
    break;
  case Instrument:
    std::operator<<(o,"instrument");
    break;
  case MergeProfiles:
    std::operator<<(o,"merge-profiles");
    break;
  case PrintProfile:
    std::operator<<(o,"print-profile");
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, WasmSplitOptions::Mode& mode) {
  switch (mode) {
    case WasmSplitOptions::Mode::Split:
      o << "split";
      break;
    case WasmSplitOptions::Mode::MultiSplit:
      o << "multi-split";
      break;
    case WasmSplitOptions::Mode::Instrument:
      o << "instrument";
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      o << "merge-profiles";
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      o << "print-profile";
      break;
  }
  return o;
}